

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O0

void loop_undo(jit_State *J,IRRef ins,SnapNo nsnap,MSize nsnapmap)

{
  SnapEntry *pSVar1;
  IRIns *pIVar2;
  SnapShot *pSVar3;
  IRIns *ir;
  BPropEntry *bp;
  SnapEntry *map;
  SnapShot *snap;
  ptrdiff_t i;
  MSize nsnapmap_local;
  SnapNo nsnap_local;
  IRRef ins_local;
  jit_State *J_local;
  
  pSVar3 = (J->cur).snap + (nsnap - 1);
  pSVar1 = (J->cur).snapmap;
  pSVar1[pSVar3->mapofs + (uint)pSVar3->nent] = pSVar1[((J->cur).snap)->nent];
  (J->cur).nsnapmap = nsnapmap;
  (J->cur).nsnap = (uint16_t)nsnap;
  (J->guardemit).irt = '\0';
  lj_ir_rollback(J,ins);
  for (snap = (SnapShot *)0x0; (long)snap < 0x10; snap = (SnapShot *)((long)&snap->mapofs + 1)) {
    if (ins <= J->bpropcache[(long)snap].val) {
      J->bpropcache[(long)snap].key = 0;
    }
  }
  for (nsnapmap_local = ins - 1; 0x8000 < nsnapmap_local; nsnapmap_local = nsnapmap_local - 1) {
    pIVar2 = (J->cur).ir;
    (&pIVar2->field_1)[nsnapmap_local].t.irt = (&pIVar2->field_1)[nsnapmap_local].t.irt & 0xbf;
    (&pIVar2->field_1)[nsnapmap_local].t.irt = (&pIVar2->field_1)[nsnapmap_local].t.irt & 0xdf;
  }
  return;
}

Assistant:

static void loop_undo(jit_State *J, IRRef ins, SnapNo nsnap, MSize nsnapmap)
{
  ptrdiff_t i;
  SnapShot *snap = &J->cur.snap[nsnap-1];
  SnapEntry *map = J->cur.snapmap;
  map[snap->mapofs + snap->nent] = map[J->cur.snap[0].nent];  /* Restore PC. */
  J->cur.nsnapmap = (uint32_t)nsnapmap;
  J->cur.nsnap = nsnap;
  J->guardemit.irt = 0;
  lj_ir_rollback(J, ins);
  for (i = 0; i < BPROP_SLOTS; i++) {  /* Remove backprop. cache entries. */
    BPropEntry *bp = &J->bpropcache[i];
    if (bp->val >= ins)
      bp->key = 0;
  }
  for (ins--; ins >= REF_FIRST; ins--) {  /* Remove flags. */
    IRIns *ir = IR(ins);
    irt_clearphi(ir->t);
    irt_clearmark(ir->t);
  }
}